

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# at_clause.cpp
# Opt level: O3

unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>,_true> __thiscall
duckdb::AtClause::Copy(AtClause *this)

{
  pointer pPVar1;
  AtClause *this_00;
  long *in_RSI;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_50;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_48;
  string local_40;
  
  pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)(in_RSI + 4));
  (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_50,pPVar1);
  this_00 = (AtClause *)operator_new(0x28);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_40,*in_RSI,in_RSI[1] + *in_RSI);
  local_48._M_head_impl = local_50._M_head_impl;
  local_50._M_head_impl = (ParsedExpression *)0x0;
  AtClause(this_00,&local_40,
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            *)&local_48);
  (this->unit)._M_dataplus._M_p = (pointer)this_00;
  if (local_48._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_48._M_head_impl = (ParsedExpression *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  return (unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>)
         (unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>)this;
}

Assistant:

unique_ptr<AtClause> AtClause::Copy() const {
	return make_uniq<AtClause>(unit, expr->Copy());
}